

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

Generator *
kratos::Generator::from_verilog
          (Context *context,string *src_file,string *top_name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *lib_files,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PortType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PortType>_>_>
          *port_types)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  pointer pbVar1;
  bool bVar2;
  Generator *generator;
  _Base_ptr p_Var3;
  iterator iVar4;
  _Rb_tree_node_base *p_Var5;
  UserException *pUVar6;
  pointer filename;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  shared_ptr<kratos::Port> sVar7;
  basic_string_view<char> bVar8;
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  undefined1 local_2d0 [8];
  ifstream f;
  undefined8 auStack_1e8 [36];
  undefined1 auStack_c8 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
  ports;
  string src;
  undefined1 local_60 [8];
  shared_ptr<kratos::Port> port_p;
  
  bVar2 = fs::exists(src_file);
  if (!bVar2) {
    pUVar6 = (UserException *)__cxa_allocate_exception(0x10);
    auStack_c8 = (undefined1  [8])(src_file->_M_dataplus)._M_p;
    ports._M_t._M_impl._0_8_ = src_file->_M_string_length;
    bVar8 = fmt::v7::to_string_view<char,_0>("{0} does not exist");
    format_str_01.data_ = (char *)bVar8.size_;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)auStack_c8;
    format_str_01.size_ = 0xd;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)local_2d0,(detail *)bVar8.data_,format_str_01,args_01);
    UserException::UserException(pUVar6,(string *)local_2d0);
    __cxa_throw(pUVar6,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  generator = Context::generator(context,top_name);
  this = &generator->lib_files_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(this,((long)(lib_files->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(lib_files->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string_const&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,src_file);
  std::ifstream::ifstream(local_2d0,(string *)src_file,_S_in);
  ports._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&src._M_string_length;
  src._M_dataplus._M_p = (pointer)0x0;
  src._M_string_length._0_1_ = 0;
  std::istream::seekg((long)local_2d0,_S_beg);
  std::istream::tellg();
  std::__cxx11::string::reserve((ulong)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::istream::seekg((long)local_2d0,_S_beg);
  __first._8_8_ = 0xffffffffffffffff;
  __first._M_sbuf = *(streambuf_type **)((long)auStack_1e8 + *(long *)((long)local_2d0 + -0x18));
  std::__cxx11::string::assign<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((string *)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count,__first,
             (istreambuf_iterator<char,_std::char_traits<char>_>)(ZEXT816(0xffffffff) << 0x40));
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,
             (generator->lib_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (lib_files->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (lib_files->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  get_port_from_verilog
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
              *)auStack_c8,generator,
             (string *)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count,top_name);
  for (p_Var3 = ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var3 != (_Rb_tree_node_base *)&ports; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_emplace_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&generator->ports_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var3 + 1));
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
    ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<kratos::Port>const&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
                *)&generator->vars_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var3 + 1),
               (shared_ptr<kratos::Port> *)(p_Var3 + 2));
  }
  filename = (generator->lib_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (generator->lib_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (filename == pbVar1) {
      p_Var5 = *(_Rb_tree_node_base **)(port_types + 0x18);
      while( true ) {
        if (p_Var5 == (_Rb_tree_node_base *)(port_types + 8)) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
                       *)auStack_c8);
          std::__cxx11::string::~string
                    ((string *)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::ifstream::~ifstream(local_2d0);
          return generator;
        }
        iVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&(generator->ports_)._M_t,(key_type *)(p_Var5 + 1));
        if ((_Rb_tree_header *)iVar4._M_node ==
            &(generator->ports_)._M_t._M_impl.super__Rb_tree_header) break;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
        ::at(&generator->vars_,(key_type *)(p_Var5 + 1));
        sVar7 = std::static_pointer_cast<kratos::Port,kratos::Var>
                          ((shared_ptr<kratos::Var> *)local_60);
        (**(code **)(*(long *)local_60 + 0x158))
                  (local_60,p_Var5[2]._M_color,
                   sVar7.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi._M_pi);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&port_p);
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      }
      pUVar6 = (UserException *)__cxa_allocate_exception(0x10);
      src.field_2._8_8_ = *(undefined8 *)(p_Var5 + 1);
      bVar8 = fmt::v7::to_string_view<char,_0>("unable to find port {0}");
      format_str_00.data_ = (char *)bVar8.size_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)((long)&src.field_2 + 8);
      format_str_00.size_ = 0xd;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)local_60,(detail *)bVar8.data_,format_str_00,args_00);
      UserException::UserException(pUVar6,(string *)local_60);
      __cxa_throw(pUVar6,&UserException::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar2 = fs::exists(filename);
    if (!bVar2) break;
    filename = filename + 1;
  }
  pUVar6 = (UserException *)__cxa_allocate_exception(0x10);
  src.field_2._8_8_ = (filename->_M_dataplus)._M_p;
  bVar8 = fmt::v7::to_string_view<char,_0>("{0} does not exist");
  format_str.data_ = (char *)bVar8.size_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)((long)&src.field_2 + 8);
  format_str.size_ = 0xd;
  fmt::v7::detail::vformat_abi_cxx11_((string *)local_60,(detail *)bVar8.data_,format_str,args);
  UserException::UserException(pUVar6,(string *)local_60);
  __cxa_throw(pUVar6,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Generator &Generator::from_verilog(Context *context, const std::string &src_file,
                                   const std::string &top_name,
                                   const std::vector<std::string> &lib_files,
                                   const std::map<std::string, PortType> &port_types) {
    if (!fs::exists(src_file)) throw UserException(::format("{0} does not exist", src_file));

    auto &mod = context->generator(top_name);
    // the src file will be treated a lib file as well
    mod.lib_files_.reserve(1 + lib_files.size());
    mod.lib_files_.emplace_back(src_file);

    std::ifstream f(src_file);
    ::string src;
    // pre-allocate the size
    f.seekg(0, std::ios::end);
    src.reserve(f.tellg());
    f.seekg(0, std::ios::beg);
    src.assign(std::istreambuf_iterator<char>(f), std::istreambuf_iterator<char>());

    mod.lib_files_.insert(mod.lib_files_.end(), lib_files.begin(), lib_files.end());
    // const auto &ports = ;
    const auto ports = get_port_from_verilog(&mod, src, top_name);
    for (auto const &[port_name, port] : ports) {
        mod.ports_.emplace(port_name);
        mod.vars_.emplace(port_name, port);
    }
    // verify the existence of each lib files
    for (auto const &filename : mod.lib_files_) {
        if (!fs::exists(filename)) throw UserException(::format("{0} does not exist", filename));
    }

    // assign port types
    for (auto const &[port_name, port_type] : port_types) {
        if (mod.ports_.find(port_name) == mod.ports_.end())
            throw UserException(::format("unable to find port {0}", port_name));
        std::shared_ptr<Var> &var_p = mod.vars_.at(port_name);
        std::shared_ptr<Port> port_p = std::static_pointer_cast<Port>(var_p);
        port_p->set_port_type(port_type);
    }

    return mod;
}